

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::ContextState::resetRunData(ContextState *this)

{
  ContextState *this_local;
  
  (this->super_TestRunStats).numTestCases = 0;
  (this->super_TestRunStats).numTestCasesPassingFilters = 0;
  (this->super_TestRunStats).numTestSuitesPassingFilters = 0;
  (this->super_TestRunStats).numTestCasesFailed = 0;
  (this->super_TestRunStats).numAsserts = 0;
  (this->super_TestRunStats).numAssertsFailed = 0;
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  return;
}

Assistant:

void resetRunData() {
            numTestCases                = 0;
            numTestCasesPassingFilters  = 0;
            numTestSuitesPassingFilters = 0;
            numTestCasesFailed          = 0;
            numAsserts                  = 0;
            numAssertsFailed            = 0;
            numAssertsCurrentTest       = 0;
            numAssertsFailedCurrentTest = 0;
        }